

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O3

void Rml::Parse::Function
               (DataParser *parser,Instruction function_type,String *func_name,
               bool first_argument_piped)

{
  char cVar1;
  ulong uVar2;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  pointer pcVar6;
  ulong uVar7;
  ulong uVar8;
  uint num_arguments;
  size_type __dnew;
  String local_58;
  size_type local_38;
  
  if (((function_type != EventFnc) && (function_type != TransformFnc)) &&
     (bVar4 = Assert("RMLUI_ASSERT(function_type == Instruction::TransformFnc || function_type == Instruction::EventFnc)"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataExpression.cpp"
                     ,0x363), !bVar4)) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  num_arguments = (uint)first_argument_piped;
  bVar5 = parser->reached_end;
  if ((bool)bVar5 == true) {
    pcVar6 = (parser->expression)._M_dataplus._M_p;
    uVar7 = parser->index;
    uVar8 = 0;
  }
  else {
    pcVar6 = (parser->expression)._M_dataplus._M_p;
    uVar7 = parser->index;
    uVar8 = (ulong)(byte)pcVar6[uVar7];
    if (pcVar6[uVar7] == 0x28) {
      DataParser::Match(parser,'(',true);
      if ((parser->reached_end == false) &&
         ((parser->expression)._M_dataplus._M_p[parser->index] == ')')) {
LAB_001f2231:
        DataParser::Match(parser,')',true);
      }
      else {
        num_arguments = (uint)first_argument_piped;
        while( true ) {
          num_arguments = num_arguments + 1;
          Expression(parser);
          DataParser::Push(parser);
          if (parser->reached_end != false) break;
          cVar1 = (parser->expression)._M_dataplus._M_p[parser->index];
          if (cVar1 != ',') {
            if (cVar1 == ')') goto LAB_001f2231;
            break;
          }
          DataParser::Match(parser,',',true);
        }
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        local_38 = 0x11;
        local_58._M_dataplus._M_p =
             (pointer)::std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
        local_58.field_2._M_allocated_capacity = local_38;
        builtin_strncpy(local_58._M_dataplus._M_p,"one of \')\' or \',\'",0x11);
        local_58._M_string_length = local_38;
        local_58._M_dataplus._M_p[local_38] = '\0';
        DataParser::Expected(parser,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
LAB_001f22b7:
      DataParser::Function(parser,function_type,num_arguments,func_name);
      return;
    }
  }
  uVar2 = (parser->expression)._M_string_length;
LAB_001f21f2:
  do {
    uVar7 = uVar7 + 1;
    if ((0x20 < (byte)uVar8) || ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0)) goto LAB_001f22b7;
    parser->index = uVar7;
    if (uVar7 < uVar2) {
      if ((bVar5 & 1) == 0) {
        uVar8 = (ulong)(byte)pcVar6[uVar7];
        goto LAB_001f21f2;
      }
    }
    else {
      parser->reached_end = true;
      bVar5 = 1;
    }
    uVar8 = 0;
  } while( true );
}

Assistant:

static void Function(DataParser& parser, Instruction function_type, String&& func_name, bool first_argument_piped)
	{
		RMLUI_ASSERT(function_type == Instruction::TransformFnc || function_type == Instruction::EventFnc);

		// We already matched the variable name, and also pushed the first argument to the stack if it was piped using '|'.
		int num_arguments = first_argument_piped ? 1 : 0;
		if (parser.Look() == '(')
		{
			bool looping = true;

			parser.Match('(');
			if (parser.Look() == ')')
			{
				parser.Match(')');
				looping = false;
			}

			while (looping)
			{
				num_arguments += 1;
				Expression(parser);
				parser.Push();

				switch (parser.Look())
				{
				case ')':
					parser.Match(')');
					looping = false;
					break;
				case ',': parser.Match(','); break;
				default:
					parser.Expected("one of ')' or ','");
					looping = false;
					break;
				}
			}
		}
		else
		{
			parser.SkipWhitespace();
		}

		parser.Function(function_type, num_arguments, std::move(func_name));
	}